

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerSettings.cpp
# Opt level: O1

void __thiscall JtagAnalyzerSettings::UpdateInterfacesFromSettings(JtagAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTmsChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTckChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTdiChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTdoChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mTrstChannelInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTAPInitialState);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mInstructRegBitOrder);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataRegBitOrder);
  AnalyzerSettingInterfaceInteger::SetInteger((int)this + 0x138);
  AnalyzerSettingInterfaceBool::SetValue((bool)((char)this + 'P'));
  return;
}

Assistant:

void JtagAnalyzerSettings::UpdateInterfacesFromSettings()
{
    mTmsChannelInterface.SetChannel( mTmsChannel );
    mTckChannelInterface.SetChannel( mTckChannel );
    mTdiChannelInterface.SetChannel( mTdiChannel );
    mTdoChannelInterface.SetChannel( mTdoChannel );
    mTrstChannelInterface.SetChannel( mTrstChannel );

    mTAPInitialStateInterface.SetNumber( mTAPInitialState );
    mInstructRegBitOrderInterface.SetNumber( mInstructRegBitOrder );
    mDataRegBitOrderInterface.SetNumber( mDataRegBitOrder );
    mShiftDRDataUnitInterface.SetInteger( mShiftDRBitsPerDataUnit );
    mShowBitCountInterface.SetValue( mShowBitCount );
}